

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

void __thiscall pbrt::BilinearPatch::BilinearPatch(BilinearPatch *this,int meshIndex,int blpIndex)

{
  ulong *puVar1;
  uint *puVar2;
  ulong *puVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  undefined4 *puVar19;
  undefined1 *puVar20;
  long lVar21;
  long lVar22;
  undefined4 *puVar23;
  long lVar24;
  long lVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM19 [64];
  Point3f p [4] [4];
  undefined1 local_f8 [4];
  float afStack_f4 [11];
  float afStack_c8 [4];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  auVar29 = in_ZMM19._0_16_;
  this->meshIndex = meshIndex;
  this->blpIndex = blpIndex;
  *(long *)(in_FS_OFFSET + -0x640) = *(long *)(in_FS_OFFSET + -0x640) + 0xc;
  lVar22 = *(long *)(*(long *)(allMeshes + 8) + (long)meshIndex * 8);
  lVar21 = (long)(blpIndex << 2);
  lVar25 = *(long *)(lVar22 + 0x10);
  lVar22 = *(long *)(lVar22 + 0x18);
  lVar24 = (long)*(int *)(lVar25 + 0xc + lVar21 * 4);
  puVar1 = (ulong *)(lVar22 + (long)*(int *)(lVar25 + lVar21 * 4) * 0xc);
  puVar2 = (uint *)(lVar22 + (long)*(int *)(lVar25 + 4 + lVar21 * 4) * 0xc);
  puVar3 = (ulong *)(lVar22 + (long)*(int *)(lVar25 + 8 + lVar21 * 4) * 0xc);
  bVar18 = IsRectangle(this);
  if (bVar18) {
    uVar4 = (undefined4)*puVar1;
    auVar26._4_4_ = uVar4;
    auVar26._0_4_ = uVar4;
    auVar26._8_4_ = uVar4;
    auVar26._12_4_ = uVar4;
    auVar29 = vinsertps_avx(ZEXT416((uint)*puVar3),ZEXT416(*puVar2),0x10);
    auVar30 = vinsertps_avx(ZEXT416(*(uint *)((long)puVar3 + 4)),ZEXT416(puVar2[1]),0x10);
    auVar31 = vinsertps_avx(ZEXT416((uint)puVar3[1]),ZEXT416(puVar2[2]),0x10);
    auVar29 = vsubps_avx(auVar26,auVar29);
    uVar4 = *(undefined4 *)((long)puVar1 + 4);
    auVar27._4_4_ = uVar4;
    auVar27._0_4_ = uVar4;
    auVar27._8_4_ = uVar4;
    auVar27._12_4_ = uVar4;
    auVar30 = vsubps_avx(auVar27,auVar30);
    uVar4 = (undefined4)puVar1[1];
    auVar35._4_4_ = uVar4;
    auVar35._0_4_ = uVar4;
    auVar35._8_4_ = uVar4;
    auVar35._12_4_ = uVar4;
    auVar34._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar34._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar34._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar34._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar30 = vfmadd231ps_fma(auVar34,auVar29,auVar29);
    auVar29 = vsubps_avx(auVar35,auVar31);
    auVar29 = vfmadd231ps_fma(auVar30,auVar29,auVar29);
    auVar30 = vsqrtps_avx(auVar29);
    auVar29 = vmovshdup_avx(auVar30);
    auVar33 = ZEXT464((uint)(auVar30._0_4_ * auVar29._0_4_));
  }
  else {
    _local_f8 = ZEXT1664(ZEXT816(0) << 0x40);
    puVar19 = (undefined4 *)(local_f8 + 8);
    local_78 = _local_f8;
    local_b8 = _local_f8;
    uVar16 = puVar1[1];
    uVar17 = puVar3[1];
    uVar5 = puVar2[2];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *puVar1;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *puVar3;
    uVar7 = *(undefined8 *)puVar2;
    uVar8 = *(undefined8 *)(lVar22 + lVar24 * 0xc);
    uVar6 = *(uint *)(lVar22 + 8 + lVar24 * 0xc);
    lVar22 = 0;
    do {
      auVar32 = vcvtsi2ss_avx512f(auVar29,(int)lVar22);
      lVar25 = 0;
      auVar37._0_4_ = auVar32._0_4_ / 3.0;
      auVar37._4_12_ = auVar32._4_12_;
      fVar10 = 1.0 - auVar37._0_4_;
      auVar32._4_4_ = fVar10;
      auVar32._0_4_ = fVar10;
      auVar32._8_4_ = fVar10;
      auVar32._12_4_ = fVar10;
      puVar23 = puVar19;
      do {
        auVar26 = vcvtsi2ss_avx512f(auVar29,(int)lVar25);
        lVar25 = lVar25 + 1;
        auVar38._0_4_ = auVar26._0_4_ / 3.0;
        auVar38._4_12_ = auVar26._4_12_;
        fVar11 = 1.0 - auVar38._0_4_;
        auVar26 = vmulss_avx512f(auVar38,ZEXT416((uint)uVar17));
        auVar27 = vmulss_avx512f(auVar38,ZEXT416(uVar6));
        auVar39._4_4_ = auVar38._0_4_;
        auVar39._0_4_ = auVar38._0_4_;
        auVar39._8_4_ = auVar38._0_4_;
        auVar39._12_4_ = auVar38._0_4_;
        auVar28 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)uVar16));
        auVar26 = vaddss_avx512f(auVar28,auVar26);
        auVar28 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416(uVar5));
        auVar40._4_4_ = fVar11;
        auVar40._0_4_ = fVar11;
        auVar40._8_4_ = fVar11;
        auVar40._12_4_ = fVar11;
        auVar27 = vaddss_avx512f(auVar28,auVar27);
        auVar26 = vmulss_avx512f(ZEXT416((uint)fVar10),auVar26);
        auVar28 = vmulps_avx512vl(auVar39,auVar31);
        auVar27 = vmulss_avx512f(auVar37,auVar27);
        auVar26 = vaddss_avx512f(auVar26,auVar27);
        auVar27 = vmulps_avx512vl(auVar40,auVar30);
        auVar27 = vaddps_avx512vl(auVar27,auVar28);
        auVar27 = vmulps_avx512vl(auVar32,auVar27);
        auVar28._0_4_ = auVar37._0_4_ * (fVar11 * (float)uVar7 + auVar38._0_4_ * (float)uVar8);
        auVar28._4_4_ =
             auVar37._0_4_ *
             (fVar11 * (float)((ulong)uVar7 >> 0x20) + auVar38._0_4_ * (float)((ulong)uVar8 >> 0x20)
             );
        auVar28._8_4_ = auVar37._0_4_ * (fVar11 * 0.0 + auVar38._0_4_ * 0.0);
        auVar28._12_4_ = auVar37._0_4_ * (fVar11 * 0.0 + auVar38._0_4_ * 0.0);
        auVar27 = vaddps_avx512vl(auVar27,auVar28);
        uVar9 = vmovlps_avx(auVar27);
        *(undefined8 *)(puVar23 + -2) = uVar9;
        *puVar23 = auVar26._0_4_;
        puVar23 = puVar23 + 3;
      } while (lVar25 != 4);
      lVar22 = lVar22 + 1;
      puVar19 = puVar19 + 0xc;
    } while (lVar22 != 4);
    puVar20 = local_b8 + 4;
    auVar33 = ZEXT864(0);
    lVar22 = 0;
    do {
      lVar22 = lVar22 + 1;
      lVar25 = lVar22 * 0x30;
      lVar21 = 0;
      auVar36 = ZEXT464((uint)*(float *)(local_f8 + lVar25 + 8));
      fVar10 = *(float *)(local_f8 + lVar25 + 4);
      fVar11 = *(float *)(local_f8 + lVar25);
      do {
        lVar24 = lVar21 + -4;
        puVar2 = (uint *)(puVar20 + lVar21);
        lVar15 = lVar21 + -8;
        fVar12 = *(float *)(puVar20 + lVar24) - afStack_f4[0];
        auVar29 = vsubss_avx512f(ZEXT416(*puVar2),ZEXT416((uint)afStack_f4[1]));
        afStack_f4[0] = *(float *)(puVar20 + lVar21 + -0x34);
        afStack_f4[1] = *(float *)(puVar20 + lVar21 + -0x30);
        fVar13 = *(float *)(puVar20 + lVar15) - (float)local_f8;
        local_f8 = *(undefined1 (*) [4])(puVar20 + lVar21 + -0x38);
        lVar21 = lVar21 + 0xc;
        fVar14 = auVar36._0_4_ - afStack_f4[1];
        fVar10 = fVar10 - afStack_f4[0];
        fVar11 = fVar11 - (float)local_f8;
        auVar30 = vmulss_avx512f(auVar29,ZEXT416((uint)fVar10));
        auVar31 = vmulss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)fVar14));
        auVar32 = vfmsub213ss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)fVar12),auVar30);
        auVar30 = vfnmadd231ss_avx512f(auVar30,auVar29,ZEXT416((uint)fVar10));
        auVar29 = vfmsub213ss_avx512f(auVar29,ZEXT416((uint)fVar11),auVar31);
        auVar31 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)fVar13),auVar31);
        auVar29 = vaddss_avx512f(auVar29,auVar31);
        auVar31 = vmulss_avx512f(ZEXT416((uint)fVar12),ZEXT416((uint)fVar11));
        auVar30 = vaddss_avx512f(auVar30,auVar32);
        auVar32 = vfmsub213ss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar13),auVar31);
        auVar31 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)fVar12),auVar31);
        auVar29 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar29._0_4_ * auVar29._0_4_)),auVar30,auVar30
                                     );
        auVar30 = ZEXT416((uint)(auVar31._0_4_ + auVar32._0_4_));
        auVar29 = vfmadd231ss_fma(auVar29,auVar30,auVar30);
        auVar29 = vsqrtss_avx(auVar29,auVar29);
        auVar29 = vfmadd231ss_fma(auVar33._0_16_,auVar29,SUB6416(ZEXT464(0x3f000000),0));
        auVar33 = ZEXT1664(auVar29);
        auVar36 = ZEXT1664(ZEXT416(*puVar2));
        fVar10 = *(float *)(puVar20 + lVar24);
        fVar11 = *(float *)(puVar20 + lVar15);
      } while (lVar21 != 0x24);
      puVar20 = puVar20 + 0x30;
      local_f8 = (undefined1  [4])*(float *)(local_f8 + lVar25);
      afStack_f4[0] = *(float *)(local_f8 + lVar25 + 4);
      afStack_f4[1] = *(float *)(local_f8 + lVar25 + 8);
    } while (lVar22 != 3);
  }
  this->area = auVar33._0_4_;
  return;
}

Assistant:

BilinearPatch::BilinearPatch(int meshIndex, int blpIndex)
    : meshIndex(meshIndex), blpIndex(blpIndex) {
    blpBytes += sizeof(*this);
    // Store area of bilinear patch in _area_
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    if (IsRectangle())
        area = Distance(p00, p01) * Distance(p00, p10);
    else {
        // Compute approximate area of bilinear patch
        // FIXME: it would be good to skip this for flat patches, or to
        // be adaptive based on curvature in some manner
        constexpr int na = 3;
        Point3f p[na + 1][na + 1];
        for (int i = 0; i <= na; ++i) {
            Float u = Float(i) / Float(na);
            for (int j = 0; j <= na; ++j) {
                Float v = Float(j) / Float(na);
                p[i][j] = Lerp(u, Lerp(v, p00, p01), Lerp(v, p10, p11));
            }
        }
        area = 0;
        for (int i = 0; i < na; ++i)
            for (int j = 0; j < na; ++j)
                area += 0.5f * Length(Cross(p[i + 1][j + 1] - p[i][j],
                                            p[i + 1][j] - p[i][j + 1]));
    }
}